

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O2

void __thiscall TimerHeap::pop(TimerHeap *this,size_t index)

{
  size_t index2;
  
  index2 = ((long)(this->timerHeap_).
                  super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->timerHeap_).
                  super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) - 1;
  if (index2 == index) {
    std::vector<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>::pop_back
              (&this->timerHeap_);
    return;
  }
  swapHeap(this,index,index2);
  std::vector<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>::pop_back
            (&this->timerHeap_);
  modify(this,index);
  return;
}

Assistant:

void TimerHeap::pop(size_t index) {
    if (timerHeap_.size() - 1 == index) {
        timerHeap_.pop_back();
    } else {
        swapHeap(index, timerHeap_.size() - 1);
        timerHeap_.pop_back();
        modify(index);
    }
}